

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::Array<kj::HttpByteRange>::~Array(Array<kj::HttpByteRange> *this)

{
  Array<kj::HttpByteRange> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }